

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::Tree::_set_hierarchy(Tree *this,size_t ichild,size_t iparent,size_t iprev_sibling)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  bool bVar12;
  ulong uVar13;
  NodeData *n;
  size_t sVar14;
  NodeData *pNVar15;
  NodeData *n_00;
  NodeData *n_01;
  size_t sVar16;
  size_t sVar17;
  long lVar18;
  char *pcVar19;
  char *pcVar20;
  byte bVar21;
  csubstr cVar22;
  char msg [69];
  char *pcStack_180;
  size_t local_178;
  char *pcStack_158;
  size_t local_150;
  char *pcStack_130;
  size_t local_128;
  char *pcStack_108;
  size_t local_100;
  char *pcStack_e0;
  size_t local_d8;
  char *pcStack_b8;
  size_t local_b0;
  char *pcStack_90;
  size_t local_88;
  char *pcStack_68;
  size_t local_60;
  char *pcStack_40;
  size_t local_38;
  
  bVar21 = 0;
  uVar13 = this->m_cap;
  if (uVar13 <= iparent && iparent != 0xffffffffffffffff) {
    pcVar19 = "check failed: (iparent == NONE || (iparent >= 0 && iparent < m_cap))";
    pcVar20 = msg;
    for (lVar18 = 0x45; lVar18 != 0; lVar18 = lVar18 + -1) {
      *pcVar20 = *pcVar19;
      pcVar19 = pcVar19 + 1;
      pcVar20 = pcVar20 + 1;
    }
    if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar22 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_38 = cVar22.len;
    pcStack_40 = cVar22.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x63cb) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x63cb) << 0x40,8);
    LVar3.name.str = pcStack_40;
    LVar3.name.len = local_38;
    (*p_Var1)(msg,0x45,LVar3,(this->m_callbacks).m_user_data);
    uVar13 = this->m_cap;
  }
  if ((iprev_sibling != 0xffffffffffffffff) && (uVar13 <= iprev_sibling)) {
    pcVar19 = 
    "check failed: (iprev_sibling == NONE || (iprev_sibling >= 0 && iprev_sibling < m_cap))";
    pcVar20 = msg;
    for (lVar18 = 0x57; lVar18 != 0; lVar18 = lVar18 + -1) {
      *pcVar20 = *pcVar19;
      pcVar19 = pcVar19 + (ulong)bVar21 * -2 + 1;
      pcVar20 = pcVar20 + (ulong)bVar21 * -2 + 1;
    }
    if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    p_Var1 = (this->m_callbacks).m_error;
    cVar22 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_60 = cVar22.len;
    pcStack_68 = cVar22.str;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x63cc) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x63cc) << 0x40,8);
    LVar4.name.str = pcStack_68;
    LVar4.name.len = local_60;
    (*p_Var1)(msg,0x57,LVar4,(this->m_callbacks).m_user_data);
  }
  n = get(this,ichild);
  n->m_parent = iparent;
  *(undefined4 *)&n->m_next_sibling = 0xffffffff;
  *(undefined4 *)((long)&n->m_next_sibling + 4) = 0xffffffff;
  *(undefined4 *)&n->m_prev_sibling = 0xffffffff;
  *(undefined4 *)((long)&n->m_prev_sibling + 4) = 0xffffffff;
  if (iparent == 0xffffffffffffffff) {
    if (ichild != 0) {
      builtin_strncpy(msg + 0x10,"child == 0)",0xc);
      builtin_strncpy(msg,"check failed: (i",0x10);
      if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      p_Var1 = (this->m_callbacks).m_error;
      cVar22 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_88 = cVar22.len;
      pcStack_90 = cVar22.str;
      LVar5.super_LineCol.col = 0;
      LVar5.super_LineCol.offset = SUB168(ZEXT816(0x63d6) << 0x40,0);
      LVar5.super_LineCol.line = SUB168(ZEXT816(0x63d6) << 0x40,8);
      LVar5.name.str = pcStack_90;
      LVar5.name.len = local_88;
      (*p_Var1)(msg,0x1c,LVar5,(this->m_callbacks).m_user_data);
    }
    if (iprev_sibling != 0xffffffffffffffff) {
      builtin_strncpy(msg,"check failed: (iprev_sibling == NONE)",0x26);
      if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
        pcVar2 = (code *)swi(3);
        (*pcVar2)();
        return;
      }
      p_Var1 = (this->m_callbacks).m_error;
      cVar22 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_b0 = cVar22.len;
      pcStack_b8 = cVar22.str;
      LVar6.super_LineCol.col = 0;
      LVar6.super_LineCol.offset = SUB168(ZEXT816(0x63d7) << 0x40,0);
      LVar6.super_LineCol.line = SUB168(ZEXT816(0x63d7) << 0x40,8);
      LVar6.name.str = pcStack_b8;
      LVar6.name.len = local_b0;
      (*p_Var1)(msg,0x26,LVar6,(this->m_callbacks).m_user_data);
    }
  }
  else {
    if (iprev_sibling == 0xffffffffffffffff) {
      sVar14 = first_child(this,iparent);
    }
    else {
      sVar14 = next_sibling(this,iprev_sibling);
    }
    pNVar15 = get(this,iparent);
    n_00 = get(this,iprev_sibling);
    n_01 = get(this,sVar14);
    if (n_00 != (NodeData *)0x0) {
      sVar16 = next_sibling(this,iprev_sibling);
      sVar17 = id(this,n_01);
      if (sVar16 != sVar17) {
        builtin_strncpy(msg,"check failed: (next_sibling(iprev_sibling) == id(nsib))",0x38);
        if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        p_Var1 = (this->m_callbacks).m_error;
        cVar22 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_d8 = cVar22.len;
        pcStack_e0 = cVar22.str;
        LVar7.super_LineCol.col = 0;
        LVar7.super_LineCol.offset = SUB168(ZEXT816(0x63e4) << 0x40,0);
        LVar7.super_LineCol.line = SUB168(ZEXT816(0x63e4) << 0x40,8);
        LVar7.name.str = pcStack_e0;
        LVar7.name.len = local_d8;
        (*p_Var1)(msg,0x38,LVar7,(this->m_callbacks).m_user_data);
      }
      sVar16 = id(this,n_00);
      n->m_prev_sibling = sVar16;
      sVar16 = id(this,n);
      n_00->m_next_sibling = sVar16;
      if (n_00->m_prev_sibling != 0xffffffffffffffff && n_00->m_prev_sibling == sVar16) {
        pcVar19 = 
        "check failed: (psib->m_prev_sibling != psib->m_next_sibling || psib->m_prev_sibling == NONE)"
        ;
        pcVar20 = msg;
        for (lVar18 = 0x5d; lVar18 != 0; lVar18 = lVar18 + -1) {
          *pcVar20 = *pcVar19;
          pcVar19 = pcVar19 + (ulong)bVar21 * -2 + 1;
          pcVar20 = pcVar20 + (ulong)bVar21 * -2 + 1;
        }
        if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        p_Var1 = (this->m_callbacks).m_error;
        cVar22 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_100 = cVar22.len;
        pcStack_108 = cVar22.str;
        LVar8.super_LineCol.col = 0;
        LVar8.super_LineCol.offset = SUB168(ZEXT816(0x63e7) << 0x40,0);
        LVar8.super_LineCol.line = SUB168(ZEXT816(0x63e7) << 0x40,8);
        LVar8.name.str = pcStack_108;
        LVar8.name.len = local_100;
        (*p_Var1)(msg,0x5d,LVar8,(this->m_callbacks).m_user_data);
      }
    }
    if (n_01 != (NodeData *)0x0) {
      sVar14 = prev_sibling(this,sVar14);
      sVar16 = id(this,n_00);
      if (sVar14 != sVar16) {
        builtin_strncpy(msg,"check failed: (prev_sibling(inext_sibling) == id(psib))",0x38);
        if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        p_Var1 = (this->m_callbacks).m_error;
        cVar22 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_128 = cVar22.len;
        pcStack_130 = cVar22.str;
        LVar9.super_LineCol.col = 0;
        LVar9.super_LineCol.offset = SUB168(ZEXT816(0x63ec) << 0x40,0);
        LVar9.super_LineCol.line = SUB168(ZEXT816(0x63ec) << 0x40,8);
        LVar9.name.str = pcStack_130;
        LVar9.name.len = local_128;
        (*p_Var1)(msg,0x38,LVar9,(this->m_callbacks).m_user_data);
      }
      sVar14 = id(this,n_01);
      n->m_next_sibling = sVar14;
      sVar14 = id(this,n);
      n_01->m_prev_sibling = sVar14;
      if ((sVar14 != 0xffffffffffffffff) && (sVar14 == n_01->m_next_sibling)) {
        pcVar19 = 
        "check failed: (nsib->m_prev_sibling != nsib->m_next_sibling || nsib->m_prev_sibling == NONE)"
        ;
        pcVar20 = msg;
        for (lVar18 = 0x5d; lVar18 != 0; lVar18 = lVar18 + -1) {
          *pcVar20 = *pcVar19;
          pcVar19 = pcVar19 + (ulong)bVar21 * -2 + 1;
          pcVar20 = pcVar20 + (ulong)bVar21 * -2 + 1;
        }
        if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        p_Var1 = (this->m_callbacks).m_error;
        cVar22 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_150 = cVar22.len;
        pcStack_158 = cVar22.str;
        LVar10.super_LineCol.col = 0;
        LVar10.super_LineCol.offset = SUB168(ZEXT816(0x63ef) << 0x40,0);
        LVar10.super_LineCol.line = SUB168(ZEXT816(0x63ef) << 0x40,8);
        LVar10.name.str = pcStack_158;
        LVar10.name.len = local_150;
        (*p_Var1)(msg,0x5d,LVar10,(this->m_callbacks).m_user_data);
      }
    }
    if (pNVar15->m_first_child == 0xffffffffffffffff) {
      if (pNVar15->m_last_child != 0xffffffffffffffff) {
        builtin_strncpy(msg + 0x20,"ild == NONE)",0xd);
        builtin_strncpy(msg + 0x10,"arent->m_last_ch",0x10);
        builtin_strncpy(msg,"check failed: (p",0x10);
        if ((((byte)s_error_flags & 1) != 0) && (bVar12 = is_debugger_attached(), bVar12)) {
          pcVar2 = (code *)swi(3);
          (*pcVar2)();
          return;
        }
        p_Var1 = (this->m_callbacks).m_error;
        cVar22 = to_csubstr(
                           "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                           );
        local_178 = cVar22.len;
        pcStack_180 = cVar22.str;
        LVar11.super_LineCol.col = 0;
        LVar11.super_LineCol.offset = SUB168(ZEXT816(0x63f4) << 0x40,0);
        LVar11.super_LineCol.line = SUB168(ZEXT816(0x63f4) << 0x40,8);
        LVar11.name.str = pcStack_180;
        LVar11.name.len = local_178;
        (*p_Var1)(msg,0x2d,LVar11,(this->m_callbacks).m_user_data);
      }
      sVar14 = id(this,n);
      pNVar15->m_first_child = sVar14;
    }
    else {
      if (n->m_next_sibling == pNVar15->m_first_child) {
        sVar14 = id(this,n);
        pNVar15->m_first_child = sVar14;
      }
      if (n->m_prev_sibling != pNVar15->m_last_child) {
        return;
      }
    }
    sVar14 = id(this,n);
    pNVar15->m_last_child = sVar14;
  }
  return;
}

Assistant:

void Tree::_set_hierarchy(size_t ichild, size_t iparent, size_t iprev_sibling)
{
    _RYML_CB_ASSERT(m_callbacks, iparent == NONE || (iparent >= 0 && iparent < m_cap));
    _RYML_CB_ASSERT(m_callbacks, iprev_sibling == NONE || (iprev_sibling >= 0 && iprev_sibling < m_cap));

    NodeData *C4_RESTRICT child = get(ichild);

    child->m_parent = iparent;
    child->m_prev_sibling = NONE;
    child->m_next_sibling = NONE;

    if(iparent == NONE)
    {
        _RYML_CB_ASSERT(m_callbacks, ichild == 0);
        _RYML_CB_ASSERT(m_callbacks, iprev_sibling == NONE);
    }

    if(iparent == NONE)
        return;

    size_t inext_sibling = iprev_sibling != NONE ? next_sibling(iprev_sibling) : first_child(iparent);
    NodeData *C4_RESTRICT parent = get(iparent);
    NodeData *C4_RESTRICT psib   = get(iprev_sibling);
    NodeData *C4_RESTRICT nsib   = get(inext_sibling);

    if(psib)
    {
        _RYML_CB_ASSERT(m_callbacks, next_sibling(iprev_sibling) == id(nsib));
        child->m_prev_sibling = id(psib);
        psib->m_next_sibling = id(child);
        _RYML_CB_ASSERT(m_callbacks, psib->m_prev_sibling != psib->m_next_sibling || psib->m_prev_sibling == NONE);
    }

    if(nsib)
    {
        _RYML_CB_ASSERT(m_callbacks, prev_sibling(inext_sibling) == id(psib));
        child->m_next_sibling = id(nsib);
        nsib->m_prev_sibling = id(child);
        _RYML_CB_ASSERT(m_callbacks, nsib->m_prev_sibling != nsib->m_next_sibling || nsib->m_prev_sibling == NONE);
    }

    if(parent->m_first_child == NONE)
    {
        _RYML_CB_ASSERT(m_callbacks, parent->m_last_child == NONE);
        parent->m_first_child = id(child);
        parent->m_last_child = id(child);
    }
    else
    {
        if(child->m_next_sibling == parent->m_first_child)
            parent->m_first_child = id(child);

        if(child->m_prev_sibling == parent->m_last_child)
            parent->m_last_child = id(child);
    }
}